

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

Hop_Obj_t * Abc_ConvertSopToAigInternal(Hop_Man_t *pMan,char *pSop)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  char *pcVar6;
  long lVar7;
  Hop_Obj_t *p0;
  
  iVar2 = Abc_SopGetVarNum(pSop);
  iVar3 = Abc_SopIsExorType(pSop);
  p0 = (Hop_Obj_t *)((ulong)pMan->pConst1 ^ 1);
  if (iVar3 == 0) {
    bVar1 = *pSop;
    if (bVar1 != 0) {
      pcVar6 = pSop;
LAB_0084fcd8:
      pHVar4 = pMan->pConst1;
      lVar7 = 0;
      do {
        if (bVar1 < 0x31) {
          if (bVar1 == 0x30) {
            pHVar5 = Hop_IthVar(pMan,(int)lVar7);
            pHVar5 = (Hop_Obj_t *)((ulong)pHVar5 ^ 1);
LAB_0084fd0a:
            pHVar4 = Hop_And(pMan,pHVar4,pHVar5);
          }
          else if ((bVar1 == 0) || (bVar1 == 0x20)) goto LAB_0084fd2e;
        }
        else if (bVar1 == 0x31) {
          pHVar5 = Hop_IthVar(pMan,(int)lVar7);
          goto LAB_0084fd0a;
        }
        bVar1 = pcVar6[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while( true );
    }
  }
  else if (0 < iVar2) {
    iVar3 = 0;
    do {
      pHVar4 = Hop_IthVar(pMan,iVar3);
      p0 = Hop_Exor(pMan,p0,pHVar4);
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar3);
  }
LAB_0084fd49:
  iVar2 = Abc_SopIsComplement(pSop);
  pHVar4 = (Hop_Obj_t *)((ulong)p0 ^ 1);
  if (iVar2 == 0) {
    pHVar4 = p0;
  }
  return pHVar4;
LAB_0084fd2e:
  p0 = Hop_Or(pMan,p0,pHVar4);
  bVar1 = pcVar6[iVar2 + 3];
  pcVar6 = pcVar6 + (iVar2 + 3);
  if (bVar1 == 0) goto LAB_0084fd49;
  goto LAB_0084fcd8;
}

Assistant:

Hop_Obj_t * Abc_ConvertSopToAigInternal( Hop_Man_t * pMan, char * pSop )
{
    Hop_Obj_t * pAnd, * pSum;
    int i, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        pSum = Hop_ManConst0(pMan); 
        for ( i = 0; i < nFanins; i++ )
            pSum = Hop_Exor( pMan, pSum, Hop_IthVar(pMan,i) );
    }
    else
    {
        // go through the cubes of the node's SOP
        pSum = Hop_ManConst0(pMan); 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            pAnd = Hop_ManConst1(pMan);
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    pAnd = Hop_And( pMan, pAnd, Hop_IthVar(pMan,i) );
                else if ( Value == '0' )
                    pAnd = Hop_And( pMan, pAnd, Hop_Not(Hop_IthVar(pMan,i)) );
            }
            // add to the sum of cubes
            pSum = Hop_Or( pMan, pSum, pAnd );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        pSum = Hop_Not(pSum);
    return pSum;
}